

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O2

void test_list_iterate(void)

{
  LIST_NODE **ppLVar1;
  DATA *pDVar2;
  int iVar3;
  int iVar4;
  LIST_NODE *pLVar5;
  LIST_NODE *pLVar6;
  LIST list;
  
  iVar4 = 1;
  list.main.p = &list.main;
  list.main.n = &list.main;
  pDVar2 = alloc_data(1);
  (pDVar2->list_node).p = list.main.p;
  (pDVar2->list_node).n = &list.main;
  ppLVar1 = &(list.main.p)->n;
  list.main.p = &pDVar2->list_node;
  *ppLVar1 = &pDVar2->list_node;
  pDVar2 = alloc_data(2);
  (pDVar2->list_node).p = list.main.p;
  (pDVar2->list_node).n = &list.main;
  (list.main.p)->n = &pDVar2->list_node;
  iVar3 = 3;
  list.main.p = &pDVar2->list_node;
  pDVar2 = alloc_data(3);
  pLVar6 = list.main.p;
  (pDVar2->list_node).p = list.main.p;
  (pDVar2->list_node).n = &list.main;
  list.main.p = &pDVar2->list_node;
  pLVar6->n = &pDVar2->list_node;
  for (pLVar6 = list.main.n; pLVar5 = &list.main, pLVar6 != &list.main; pLVar6 = pLVar6->n) {
    acutest_check_((uint)(iVar4 == *(int *)&pLVar6[-1].n),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                   ,0x51,"%s","data->value == n");
    iVar4 = iVar4 + 1;
  }
  while (pLVar5 = pLVar5->p, pLVar5 != &list.main) {
    acutest_check_((uint)(iVar3 == *(int *)&pLVar5[-1].n),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                   ,0x57,"%s","data->value == n");
    iVar3 = iVar3 + -1;
  }
  iVar4 = 3;
  while (list.main.n != &list.main) {
    pLVar6 = (list.main.n)->p;
    pLVar5 = (list.main.n)->n;
    pLVar6->n = pLVar5;
    pLVar5->p = pLVar6;
    free(&list.main.n[-1].n);
    iVar4 = iVar4 + -1;
  }
  acutest_check_((uint)(iVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x62,"%s","n == 3");
  return;
}

Assistant:

static void
test_list_iterate(void)
{
    LIST list;
    LIST_NODE* node;
    DATA* data;
    int n;

    /* Create simple list. */
    list_init(&list);
    list_append(&list, &alloc_data(1)->list_node);
    list_append(&list, &alloc_data(2)->list_node);
    list_append(&list, &alloc_data(3)->list_node);

    /* Iterate forward. */
    for(node = list_head(&list), n = 1; node != list_end(&list); node = list_next(node), n++) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Iterate backward. */
    for(node = list_tail(&list), n = 3; node != list_end(&list); node = list_prev(node), n--) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Clean up. */
    n = 0;
    while(!list_is_empty(&list)) {
        node = list_head(&list);
        list_remove(&list, node);
        free(LIST_DATA(node, DATA, list_node));
        n++;
    }
    TEST_CHECK(n == 3);
}